

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::Functions::OuterProduct<3,_4>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<3,_4> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_4> *pVVar1;
  Mul *pMVar2;
  long lVar3;
  bool *pbVar4;
  undefined1 local_92;
  undefined1 local_91;
  IRet *local_90;
  Vector<tcu::Interval,_3> *local_88;
  long local_80;
  IArgs *local_78;
  long local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  local_78 = iargs;
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix(__return_storage_ptr__);
  local_80 = 0;
  local_90 = __return_storage_ptr__;
  do {
    local_70 = local_80 * 0x18;
    lVar3 = 0;
    local_88 = (Vector<tcu::Interval,_3> *)__return_storage_ptr__;
    do {
      pbVar4 = &local_78->a->m_data[0].m_hasNaN + local_70;
      pVVar1 = local_78->b;
      pMVar2 = instance<vkt::shaderexecutor::Functions::Mul>();
      local_50 = &local_92;
      local_68 = pbVar4;
      local_60 = &pVVar1->m_data[0].m_hasNaN + lVar3;
      local_58 = &local_91;
      (**(code **)((long)*pMVar2 + 0x40))(&local_48,pMVar2,ctx,&local_68);
      ((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)
      ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data[0].m_hi =
           local_38;
      *(undefined8 *)
       ((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)
       ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data = local_48;
      ((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)
      ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data[0].m_lo =
           dStack_40;
      lVar3 = lVar3 + 0x18;
      __return_storage_ptr__ = (IRet *)((long)__return_storage_ptr__ + 0x48);
    } while (lVar3 != 0x60);
    local_80 = local_80 + 1;
    __return_storage_ptr__ = (IRet *)(local_88->m_data + 1);
  } while (local_80 != 3);
  return local_90;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}